

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::ArrayFeatureType::ByteSizeLong(ArrayFeatureType *this)

{
  uint32_t uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  
  sVar2 = google::protobuf::internal::WireFormatLite::Int64Size(&this->shape_);
  if (sVar2 == 0) {
    lVar5 = 0;
  }
  else {
    uVar4 = (long)(int)sVar2 | 1;
    lVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    lVar5 = (ulong)((int)lVar5 * 9 + 0x49U >> 6) + 1;
  }
  (this->_shape_cached_byte_size_).super___atomic_base<int>._M_i = (int)sVar2;
  sVar2 = lVar5 + sVar2;
  if ((long)this->datatype_ != 0) {
    uVar4 = (long)this->datatype_ | 1;
    lVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    sVar2 = sVar2 + ((int)lVar5 * 9 + 0x49U >> 6) + 1;
  }
  if (this->_oneof_case_[0] == 0x1f) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::ArrayFeatureType_ShapeRange>
                      ((this->ShapeFlexibility_).shaperange_);
  }
  else {
    if (this->_oneof_case_[0] != 0x15) goto LAB_0019e444;
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::ArrayFeatureType_EnumeratedShapes>
                      ((this->ShapeFlexibility_).enumeratedshapes_);
  }
  sVar2 = sVar2 + sVar3 + 2;
LAB_0019e444:
  uVar1 = this->_oneof_case_[1];
  if (uVar1 == 0x3d) {
    sVar2 = sVar2 + 10;
  }
  else if (uVar1 == 0x33) {
    sVar2 = sVar2 + 6;
  }
  else if (uVar1 == 0x29) {
    uVar4 = (long)(this->defaultOptionalValue_).intdefaultvalue_ | 1;
    lVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    sVar2 = sVar2 + ((int)lVar5 * 9 + 0x49U >> 6) + 2;
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar4 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

size_t ArrayFeatureType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ArrayFeatureType)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated int64 shape = 1;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int64Size(this->shape_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _shape_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
  if (this->_internal_datatype() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_datatype());
  }

  switch (ShapeFlexibility_case()) {
    // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
    case kEnumeratedShapes: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ShapeFlexibility_.enumeratedshapes_);
      break;
    }
    // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
    case kShapeRange: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ShapeFlexibility_.shaperange_);
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  switch (defaultOptionalValue_case()) {
    // int32 intDefaultValue = 41;
    case kIntDefaultValue: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_intdefaultvalue());
      break;
    }
    // float floatDefaultValue = 51;
    case kFloatDefaultValue: {
      total_size += 2 + 4;
      break;
    }
    // double doubleDefaultValue = 61;
    case kDoubleDefaultValue: {
      total_size += 2 + 8;
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}